

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool SparseKeyTest<8192,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  Blob<160> h;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_468;
  value_type local_448;
  Blob<8192> local_430;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar2,(ulong)(uint)setbits
        );
  local_468.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&local_430,0,0x400);
  if (iVar3 != 0) {
    local_448.bytes[0] = '\0';
    local_448.bytes[1] = '\0';
    local_448.bytes[2] = '\0';
    local_448.bytes[3] = '\0';
    local_448.bytes[4] = '\0';
    local_448.bytes[5] = '\0';
    local_448.bytes[6] = '\0';
    local_448.bytes[7] = '\0';
    local_448.bytes[8] = '\0';
    local_448.bytes[9] = '\0';
    local_448.bytes[10] = '\0';
    local_448.bytes[0xb] = '\0';
    local_448.bytes[0xc] = '\0';
    local_448.bytes[0xd] = '\0';
    local_448.bytes[0xe] = '\0';
    local_448.bytes[0xf] = '\0';
    local_448.bytes[0x10] = '\0';
    local_448.bytes[0x11] = '\0';
    local_448.bytes[0x12] = '\0';
    local_448.bytes[0x13] = '\0';
    (*hash.m_hash)(&local_430,0x400,0,&local_448);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(&local_468,&local_448);
  }
  SparseKeygenRecurse<Blob<8192>,Blob<160>>(hash.m_hash,0,setbits,inclusive,&local_430,&local_468);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_468.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_468.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_468,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_468.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}